

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall duckdb::StringValueScanner::ProcessOverBufferValue(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  shared_ptr<duckdb::CSVBufferHandle,_true> *psVar1;
  StringValueResult *result;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  idx_t *piVar2;
  byte bVar3;
  CSVState CVar4;
  CSVState CVar5;
  char cVar6;
  char quote;
  data_ptr_t pdVar7;
  CSVStates *pCVar8;
  size_type sVar9;
  idx_t iVar10;
  char *pcVar11;
  bool bVar12;
  CSVBufferHandle *pCVar13;
  CSVStateMachine *pCVar14;
  reference pvVar15;
  ulong uVar16;
  InternalException *this_02;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  idx_t iVar21;
  char *pcVar22;
  optional_ptr<duckdb::FileBuffer,_true> *this_03;
  long lVar23;
  long lVar24;
  idx_t iVar25;
  string over_buffer_string;
  undefined1 local_88 [12];
  undefined4 uStack_7c;
  string local_78;
  char *local_58;
  idx_t local_50;
  char local_48 [16];
  idx_t local_38;
  
  iVar25 = (this->result).super_ScannerResult.last_position.buffer_pos;
  psVar1 = &this->previous_buffer_handle;
  pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  if (iVar25 != pCVar13->actual_size) {
    *(undefined2 *)(this->super_BaseScanner).states.states = 0xb0b;
  }
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = '\0';
  pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  this_03 = &(pCVar13->handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_03);
  result = &this->result;
  pdVar7 = this_03->ptr->buffer;
  (this->result).super_ScannerResult.quoted = false;
  this_00 = &(this->super_BaseScanner).state_machine;
  iVar21 = 0;
  for (iVar25 = (this->result).super_ScannerResult.last_position.buffer_pos;
      pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1),
      iVar25 < pCVar13->actual_size; iVar25 = iVar25 + 1) {
    pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    bVar3 = pdVar7[iVar25];
    CVar4 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar4;
    CVar4 = pCVar14->transition_array->state_machine[bVar3][CVar4];
    (this->super_BaseScanner).states.states[1] = CVar4;
    if (1 < (byte)(CVar4 - RECORD_SEPARATOR)) {
      if (CVar4 == DELIMITER) break;
      if ((this->result).super_ScannerResult.comment == false) {
        ::std::__cxx11::string::push_back((char)&local_58);
      }
      CVar4 = (this->super_BaseScanner).states.states[0];
      if (CVar4 == QUOTED) {
        if ((result->super_ScannerResult).quoted == false) {
          (this->result).super_ScannerResult.quoted_position = iVar21;
        }
        (this->result).super_ScannerResult.quoted = true;
        (this->result).super_ScannerResult.unquoted = true;
      }
      if (CVar4 == UNQUOTED) {
        pCVar8 = (this->result).super_ScannerResult.states;
        if (((pCVar8->states[0] == UNQUOTED) && (pCVar8->states[1] == UNQUOTED)) &&
           ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.escape.value != '\0')) {
          (this->result).super_ScannerResult.escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
      }
      CVar5 = (this->super_BaseScanner).states.states[1];
      switch(CVar5) {
      case QUOTED:
        bVar12 = CVar4 == MAYBE_QUOTED || CVar4 == UNQUOTED;
        break;
      case UNQUOTED:
        bVar12 = CVar4 == MAYBE_QUOTED;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        goto switchD_0180cce5_caseD_9;
      case INVALID:
        goto switchD_0180cce5_caseD_a;
      default:
        goto switchD_0180cce5_caseD_b;
      case COMMENT:
        goto switchD_0180cce5_caseD_e;
      }
      if (bVar12) {
switchD_0180cce5_caseD_9:
        if ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.escape.value != '\0') {
          (this->result).super_ScannerResult.escaped = true;
        }
      }
      if (CVar5 == INVALID) {
switchD_0180cce5_caseD_a:
        StringValueResult::InvalidState(result);
      }
      else if (CVar5 == COMMENT) {
switchD_0180cce5_caseD_e:
        (this->result).super_ScannerResult.comment = true;
        if (CVar5 == INVALID) goto switchD_0180cce5_caseD_a;
      }
switchD_0180cce5_caseD_b:
      iVar21 = iVar21 + 1;
    }
  }
  if ((local_50 == 0) &&
     (pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar14->dialect_options).state_machine_options.new_line.value == CARRY_ON)) {
    if ((this->super_BaseScanner).iterator.is_set == true) {
      this_01 = &(this->super_BaseScanner).cur_buffer_handle;
      while (uVar16 = (this->super_BaseScanner).iterator.pos.buffer_pos,
            pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01),
            uVar16 < pCVar13->actual_size) {
        iVar25 = (this->super_BaseScanner).iterator.pos.buffer_pos;
        cVar6 = (this->super_BaseScanner).buffer_handle_ptr[iVar25];
        if (cVar6 == '\n') {
          pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
          if (iVar25 + 1 == pCVar13->actual_size) goto LAB_0180d40c;
        }
        else {
          if (cVar6 != '\r') break;
          uVar16 = (this->result).super_ScannerResult.last_position.buffer_pos;
          pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
          if (uVar16 <= pCVar13->actual_size) {
            pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
            StringValueResult::AddValue(result,pCVar13->actual_size);
            if ((this->result).super_ScannerResult.comment == true) {
              StringValueResult::UnsetComment
                        (result,(this->super_BaseScanner).iterator.pos.buffer_pos);
            }
            else {
              pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
              StringValueResult::AddRow(result,pCVar13->actual_size);
            }
            pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            while( true ) {
              iVar25 = (this->super_BaseScanner).iterator.pos.buffer_pos;
              (this->super_BaseScanner).iterator.pos.buffer_pos = iVar25 + 1;
              bVar3 = (this->super_BaseScanner).buffer_handle_ptr[iVar25];
              CVar4 = (this->super_BaseScanner).states.states[1];
              (this->super_BaseScanner).states.states[0] = CVar4;
              (this->super_BaseScanner).states.states[1] =
                   pCVar14->transition_array->state_machine[bVar3][CVar4];
              uVar16 = (this->super_BaseScanner).iterator.pos.buffer_pos;
              pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
              local_78._4_8_ =
                   (char *)CONCAT44((undefined4)local_78._M_string_length,
                                    local_78._M_dataplus._M_p._4_4_);
              if ((pCVar13->actual_size <= uVar16) ||
                 ((cVar6 = (this->super_BaseScanner).buffer_handle_ptr
                           [(this->super_BaseScanner).iterator.pos.buffer_pos], cVar6 != '\r' &&
                  (local_78._4_8_ =
                        (char *)CONCAT44((undefined4)local_78._M_string_length,
                                         local_78._M_dataplus._M_p._4_4_), cVar6 != '\n')))) break;
              pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            }
            goto LAB_0180d40c;
          }
        }
        pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        iVar25 = (this->super_BaseScanner).iterator.pos.buffer_pos;
        bVar3 = (this->super_BaseScanner).buffer_handle_ptr[iVar25];
        CVar4 = (this->super_BaseScanner).states.states[1];
        (this->super_BaseScanner).states.states[0] = CVar4;
        (this->super_BaseScanner).states.states[1] =
             pCVar14->transition_array->state_machine[bVar3][CVar4];
        (this->super_BaseScanner).iterator.pos.buffer_pos = iVar25 + 1;
      }
    }
    else {
      iVar25 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      if ((this->super_BaseScanner).buffer_handle_ptr[iVar25] == '\n') {
        (this->super_BaseScanner).iterator.pos.buffer_pos = iVar25 + 1;
      }
    }
  }
  psVar1 = &(this->super_BaseScanner).cur_buffer_handle;
  while (uVar16 = (this->super_BaseScanner).iterator.pos.buffer_pos,
        pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1),
        uVar16 < pCVar13->actual_size) {
    pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    bVar3 = (this->super_BaseScanner).buffer_handle_ptr
            [(this->super_BaseScanner).iterator.pos.buffer_pos];
    CVar4 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar4;
    CVar5 = pCVar14->transition_array->state_machine[bVar3][CVar4];
    (this->super_BaseScanner).states.states[1] = CVar5;
    if (((byte)(CVar5 - RECORD_SEPARATOR) < 2) &&
       ((CVar4 == NOT_SET || (CVar4 == RECORD_SEPARATOR)))) {
      pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar14->dialect_options).num_cols == 1) break;
    }
    else {
      if ((CVar5 == DELIMITER) ||
         ((byte)(CVar4 - QUOTED) < 0xfe && (byte)(CVar5 - RECORD_SEPARATOR) < 2)) break;
      if ((CVar5 != COMMENT) && ((this->result).super_ScannerResult.comment == false)) {
        ::std::__cxx11::string::push_back((char)&local_58);
      }
      CVar4 = (this->super_BaseScanner).states.states[0];
      if (CVar4 == QUOTED) {
        if ((result->super_ScannerResult).quoted == false) {
          (this->result).super_ScannerResult.quoted_position = iVar21;
        }
        (this->result).super_ScannerResult.quoted = true;
        (this->result).super_ScannerResult.unquoted = true;
      }
      CVar5 = (this->super_BaseScanner).states.states[1];
      switch(CVar5) {
      case QUOTED:
        bVar12 = CVar4 == MAYBE_QUOTED || CVar4 == UNQUOTED;
        break;
      case UNQUOTED:
        bVar12 = CVar4 == MAYBE_QUOTED;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        goto switchD_0180cf26_caseD_9;
      case INVALID:
        goto switchD_0180cf26_caseD_a;
      default:
        goto switchD_0180cf26_caseD_b;
      case COMMENT:
        (this->result).super_ScannerResult.comment = true;
        goto LAB_0180cf5f;
      }
      if (bVar12) {
switchD_0180cf26_caseD_9:
        if ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.escape.value != '\0') {
          (this->result).super_ScannerResult.escaped = true;
        }
      }
LAB_0180cf5f:
      if (CVar5 == INVALID) {
switchD_0180cf26_caseD_a:
        StringValueResult::InvalidState(result);
      }
switchD_0180cf26_caseD_b:
      iVar21 = iVar21 + 1;
    }
    piVar2 = &(this->super_BaseScanner).iterator.pos.buffer_pos;
    *piVar2 = *piVar2 + 1;
  }
  iVar25 = local_50;
  pcVar22 = local_58;
  if ((((this->result).projecting_columns == true) &&
      (uVar16 = (this->result).cur_col_id,
      (this->result).projected_columns.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar16] == false)) &&
     (uVar16 != (this->result).number_of_columns)) {
    (this->result).cur_col_id = uVar16 + 1;
    local_78._4_8_ =
         (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_);
    if (((byte)((this->super_BaseScanner).states.states[1] - RECORD_SEPARATOR) < 2) &&
       ((CVar4 = (this->super_BaseScanner).states.states[0], CVar4 == RECORD_SEPARATOR ||
        (local_78._4_8_ =
              (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_
                              ), CVar4 == NOT_SET)))) {
      pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar14->dialect_options).num_cols == 1) {
        StringValueResult::EmptyLine(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
      }
    }
  }
  else {
    if (((result->super_ScannerResult).quoted == true) &&
       ((this->result).super_ScannerResult.comment == false)) {
      uVar16 = (this->result).super_ScannerResult.quoted_position;
      lVar23 = ~uVar16 + local_50;
      lVar24 = lVar23;
      if (lVar23 != 0) {
        pcVar17 = local_58 + local_50;
        lVar19 = lVar23;
        do {
          pcVar17 = pcVar17 + -1;
          lVar24 = lVar23;
          if (((this->result).ignore_empty_values == false) || (lVar24 = lVar19, *pcVar17 != ' '))
          goto LAB_0180d136;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        lVar24 = 0;
      }
LAB_0180d136:
      pcVar17 = local_58 + uVar16;
      uVar20 = (uint)lVar24;
      if (uVar20 < 0xd) {
        local_78._M_string_length._0_4_ = 0;
        local_78._M_dataplus._M_p._0_4_ = 0;
        local_78._M_dataplus._M_p._4_4_ = 0;
        pcVar11 = (char *)0x0;
        if (uVar20 != 0) {
          switchD_015ff80e::default(&local_78,pcVar17,(ulong)(uVar20 & 0xf));
          pcVar11 = (char *)CONCAT44((undefined4)local_78._M_string_length,
                                     local_78._M_dataplus._M_p._4_4_);
        }
      }
      else {
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)pcVar17;
        pcVar11 = pcVar17;
      }
      local_78._M_string_length._0_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
      local_78._M_dataplus._M_p._4_4_ = SUB84(pcVar11,0);
      local_88._8_4_ = local_78._M_dataplus._M_p._4_4_;
      local_88[4] = local_78._M_dataplus._M_p._0_1_;
      local_88[5] = local_78._M_dataplus._M_p._1_1_;
      local_88[6] = local_78._M_dataplus._M_p._2_1_;
      local_88[7] = local_78._M_dataplus._M_p._3_1_;
      local_88._0_4_ = uVar20;
      uStack_7c = (undefined4)local_78._M_string_length;
      local_78._4_8_ = pcVar11;
      if ((this->result).super_ScannerResult.escaped == true) {
        bVar12 = StringValueResult::HandleTooManyColumnsError(result,pcVar22,iVar25);
        iVar25 = local_50;
        if (!bVar12) {
          pcVar22 = local_58 + (this->result).super_ScannerResult.quoted_position;
          pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          local_38 = CONCAT71(local_38._1_7_,
                              (pCVar14->dialect_options).state_machine_options.escape.value);
          pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          cVar6 = (pCVar14->dialect_options).state_machine_options.quote.value;
          bVar12 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.strict_mode.value;
          pvVar15 = vector<duckdb::Vector,_true>::operator[]
                              (&(this->result).parse_chunk.data,(this->result).chunk_col_id);
          _local_88 = (anon_struct_16_3_d7536bce_for_pointer)
                      RemoveEscape(pcVar22,iVar25 - 2,(char)local_38,cVar6,bVar12,pvVar15);
        }
      }
    }
    else {
      uVar20 = (uint)local_50;
      if (uVar20 < 0xd) {
        local_78._M_string_length._0_4_ = 0;
        local_78._M_dataplus._M_p._0_4_ = 0;
        local_78._M_dataplus._M_p._4_4_ = 0;
        if (uVar20 != 0) {
          switchD_015ff80e::default(&local_78,local_58,(ulong)(uVar20 & 0xf));
        }
      }
      else {
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)local_58;
        local_78._M_dataplus._M_p._4_4_ = SUB84(local_58,0);
        local_78._M_string_length._0_4_ = (undefined4)((ulong)local_58 >> 0x20);
      }
      local_88._8_4_ = local_78._M_dataplus._M_p._4_4_;
      local_88[4] = local_78._M_dataplus._M_p._0_1_;
      local_88[5] = local_78._M_dataplus._M_p._1_1_;
      local_88[6] = local_78._M_dataplus._M_p._2_1_;
      local_88[7] = local_78._M_dataplus._M_p._3_1_;
      local_88._0_4_ = uVar20;
      uStack_7c = (undefined4)local_78._M_string_length;
      local_78._4_8_ =
           (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_);
      if ((this->result).super_ScannerResult.escaped == true) {
        bVar12 = StringValueResult::HandleTooManyColumnsError(result,pcVar22,iVar25);
        pcVar22 = local_58;
        local_78._4_8_ =
             (char *)CONCAT44((undefined4)local_78._M_string_length,local_78._M_dataplus._M_p._4_4_)
        ;
        if (!bVar12) {
          local_38 = local_50;
          pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          cVar6 = (pCVar14->dialect_options).state_machine_options.escape.value;
          pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          quote = (pCVar14->dialect_options).state_machine_options.quote.value;
          bVar12 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.strict_mode.value;
          pvVar15 = vector<duckdb::Vector,_true>::operator[]
                              (&(this->result).parse_chunk.data,(this->result).chunk_col_id);
          _local_88 = (anon_struct_16_3_d7536bce_for_pointer)
                      RemoveEscape(pcVar22,local_38,cVar6,quote,bVar12,pvVar15);
        }
      }
    }
    if (((byte)((this->super_BaseScanner).states.states[1] - RECORD_SEPARATOR) < 2) &&
       ((CVar4 = (this->super_BaseScanner).states.states[0], CVar4 == NOT_SET ||
        (CVar4 == RECORD_SEPARATOR)))) {
      pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar14->dialect_options).num_cols == 1) {
        StringValueResult::EmptyLine(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
        goto LAB_0180d2c4;
      }
    }
    CVar4 = (this->super_BaseScanner).states.states[1];
    if ((CVar4 != NOT_SET) &&
       (((this->result).super_ScannerResult.comment != true || (local_88._0_4_ != 0)))) {
      uVar16 = (ulong)(uint)local_88._0_4_;
      if ((CVar4 == DELIMITER) &&
         ((sVar9 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.delimiter.value._M_string_length, sVar9 != 0 &&
          (uVar18 = sVar9 - 1, bVar12 = uVar16 < uVar18, uVar16 = uVar16 - uVar18, bVar12)))) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "Value size is lower than the number of extra delimiter bytes in the ProcessOverBufferValue()"
                   ,"");
        InternalException::InternalException(this_02,&local_78);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((uint)local_88._0_4_ < 0xd) {
        pcVar22 = local_88 + 4;
      }
      else {
        pcVar22 = stack0xffffffffffffff80;
      }
      StringValueResult::AddValueToVector(result,pcVar22,uVar16,true);
    }
  }
LAB_0180d2c4:
  if ((1 < (byte)((this->super_BaseScanner).states.states[0] - RECORD_SEPARATOR)) &&
     (0xfd < (byte)((this->super_BaseScanner).states.states[1] - QUOTED))) {
    if ((this->result).super_ScannerResult.comment == true) {
      iVar25 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      uVar16 = (this->result).super_ScannerResult.last_position.buffer_pos;
      uVar18 = (this->result).position_before_comment;
      if (uVar16 < uVar18) {
        do {
          if ((this->result).buffer_ptr[uVar16] != ' ') goto LAB_0180d32a;
          uVar16 = uVar16 + 1;
        } while (uVar18 != uVar16);
      }
      else if ((this->result).cur_col_id != 0) {
LAB_0180d32a:
        StringValueResult::AddRow(result,uVar18);
      }
      if ((this->result).number_of_rows == 0) {
        (this->result).first_line_is_comment = true;
      }
      (this->result).super_ScannerResult.comment = false;
      (this->result).super_ScannerResult.last_position.buffer_pos =
           ((((this->result).super_ScannerResult.state_machine)->dialect_options).
            state_machine_options.new_line.value == CARRY_ON) + iVar25 + 1;
      (this->result).cur_col_id = 0;
      (this->result).chunk_col_id = 0;
    }
    else {
      StringValueResult::AddRowInternal(result);
    }
    piVar2 = &(this->super_BaseScanner).lines_read;
    *piVar2 = *piVar2 + 1;
  }
  uVar16 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  if (pCVar13->actual_size <= uVar16) {
    pCVar13 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
    if (pCVar13->is_last_buffer == true) {
      (this->result).added_last_line = true;
    }
  }
  if ((this->super_BaseScanner).states.states[1] == CARRIAGE_RETURN) {
    pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    if ((pCVar14->dialect_options).state_machine_options.new_line.value == CARRY_ON) {
      iVar25 = (this->super_BaseScanner).iterator.pos.buffer_idx;
      iVar21 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      (this->super_BaseScanner).iterator.pos.buffer_pos = iVar21 + 1;
      iVar21 = iVar21 + 2;
      goto LAB_0180d3e2;
    }
  }
  iVar25 = (this->super_BaseScanner).iterator.pos.buffer_idx;
  iVar21 = (this->super_BaseScanner).iterator.pos.buffer_pos + 1;
  (this->super_BaseScanner).iterator.pos.buffer_pos = iVar21;
LAB_0180d3e2:
  iVar10 = (this->result).buffer_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar21;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar10;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar25;
  (this->result).super_ScannerResult.quoted = false;
  (this->result).super_ScannerResult.escaped = false;
LAB_0180d40c:
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void StringValueScanner::ProcessOverBufferValue() {
	// Process first string
	if (result.last_position.buffer_pos != previous_buffer_handle->actual_size) {
		states.Initialize();
	}

	string over_buffer_string;
	auto previous_buffer = previous_buffer_handle->Ptr();
	idx_t j = 0;
	result.quoted = false;
	for (idx_t i = result.last_position.buffer_pos; i < previous_buffer_handle->actual_size; i++) {
		state_machine->Transition(states, previous_buffer[i]);
		if (states.EmptyLine() || states.IsCurrentNewRow()) {
			continue;
		}
		if (states.NewRow() || states.NewValue()) {
			break;
		} else if (!result.comment) {
			over_buffer_string += previous_buffer[i];
		}
		if (states.IsQuoted()) {
			result.SetQuoted(result, j);
		}
		if (states.IsUnquoted()) {
			result.SetUnquoted(result);
		}
		if (states.IsEscaped() && result.state_machine.dialect_options.state_machine_options.escape != '\0') {
			result.escaped = true;
		}
		if (states.IsComment()) {
			result.comment = true;
		}
		if (states.IsInvalid()) {
			result.InvalidState(result);
		}
		j++;
	}
	if (over_buffer_string.empty() &&
	    state_machine->dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		if (!iterator.IsBoundarySet()) {
			if (buffer_handle_ptr[iterator.pos.buffer_pos] == '\n') {
				iterator.pos.buffer_pos++;
			}
		} else {
			while (iterator.pos.buffer_pos < cur_buffer_handle->actual_size &&
			       (buffer_handle_ptr[iterator.pos.buffer_pos] == '\n' ||
			        buffer_handle_ptr[iterator.pos.buffer_pos] == '\r')) {
				if (buffer_handle_ptr[iterator.pos.buffer_pos] == '\r') {
					if (result.last_position.buffer_pos <= previous_buffer_handle->actual_size) {
						// we add the value
						result.AddValue(result, previous_buffer_handle->actual_size);
						if (result.IsCommentSet(result)) {
							result.UnsetComment(result, iterator.pos.buffer_pos);
						} else {
							result.AddRow(result, previous_buffer_handle->actual_size);
						}
						state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos++]);
						while (iterator.pos.buffer_pos < cur_buffer_handle->actual_size &&
						       (buffer_handle_ptr[iterator.pos.buffer_pos] == '\r' ||
						        buffer_handle_ptr[iterator.pos.buffer_pos] == '\n')) {
							state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos++]);
						}
						return;
					}
				} else {
					if (iterator.pos.buffer_pos + 1 == cur_buffer_handle->actual_size) {
						return;
					}
				}
				state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
				iterator.pos.buffer_pos++;
			}
		}
	}
	// second buffer
	for (; iterator.pos.buffer_pos < cur_buffer_handle->actual_size; iterator.pos.buffer_pos++) {
		state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
		if (states.EmptyLine()) {
			if (state_machine->dialect_options.num_cols == 1) {
				break;
			}
			continue;
		}
		if (states.NewRow() || states.NewValue()) {
			break;
		} else if (!result.comment && !states.IsComment()) {
			over_buffer_string += buffer_handle_ptr[iterator.pos.buffer_pos];
		}
		if (states.IsQuoted()) {
			result.SetQuoted(result, j);
		}
		if (states.IsComment()) {
			result.comment = true;
		}
		if (states.IsEscaped() && result.state_machine.dialect_options.state_machine_options.escape != '\0') {
			result.escaped = true;
		}
		if (states.IsInvalid()) {
			result.InvalidState(result);
		}
		j++;
	}
	bool skip_value = false;
	if (result.projecting_columns) {
		if (!result.projected_columns[result.cur_col_id] && result.cur_col_id != result.number_of_columns) {
			result.cur_col_id++;
			skip_value = true;
		}
	}
	if (!skip_value) {
		string_t value;
		if (result.quoted && !result.comment) {
			idx_t length = over_buffer_string.size() - 1 - result.quoted_position;
			while (length > 0 && result.ignore_empty_values &&
			       over_buffer_string.c_str()[result.quoted_position + length] == ' ') {
				length--;
			}
			value = string_t(over_buffer_string.c_str() + result.quoted_position, UnsafeNumericCast<uint32_t>(length));
			if (result.escaped) {
				if (!result.HandleTooManyColumnsError(over_buffer_string.c_str(), over_buffer_string.size())) {
					const auto str_ptr = over_buffer_string.c_str() + result.quoted_position;
					value =
					    RemoveEscape(str_ptr, over_buffer_string.size() - 2,
					                 state_machine->dialect_options.state_machine_options.escape.GetValue(),
					                 state_machine->dialect_options.state_machine_options.quote.GetValue(),
					                 result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
					                 result.parse_chunk.data[result.chunk_col_id]);
				}
			}
		} else {
			value = string_t(over_buffer_string.c_str(), UnsafeNumericCast<uint32_t>(over_buffer_string.size()));
			if (result.escaped) {
				if (!result.HandleTooManyColumnsError(over_buffer_string.c_str(), over_buffer_string.size())) {
					value =
					    RemoveEscape(over_buffer_string.c_str(), over_buffer_string.size(),
					                 state_machine->dialect_options.state_machine_options.escape.GetValue(),
					                 state_machine->dialect_options.state_machine_options.quote.GetValue(),
					                 result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
					                 result.parse_chunk.data[result.chunk_col_id]);
				}
			}
		}
		if (states.EmptyLine() && state_machine->dialect_options.num_cols == 1) {
			result.EmptyLine(result, iterator.pos.buffer_pos);
		} else if (!states.IsNotSet() && (!result.comment || !value.Empty())) {
			idx_t value_size = value.GetSize();
			if (states.IsDelimiter() &&
			    !result.state_machine.dialect_options.state_machine_options.delimiter.GetValue().empty()) {
				idx_t extra_delimiter_bytes =
				    result.state_machine.dialect_options.state_machine_options.delimiter.GetValue().size() - 1;
				if (extra_delimiter_bytes > value_size) {
					throw InternalException(
					    "Value size is lower than the number of extra delimiter bytes in the ProcessOverBufferValue()");
				}
				value_size -= extra_delimiter_bytes;
			}
			result.AddValueToVector(value.GetData(), value_size, true);
		}
	} else {
		if (states.EmptyLine() && state_machine->dialect_options.num_cols == 1) {
			result.EmptyLine(result, iterator.pos.buffer_pos);
		}
	}

	if (states.NewRow() && !states.IsNotSet()) {
		if (result.IsCommentSet(result)) {
			result.UnsetComment(result, iterator.pos.buffer_pos);
		} else {
			result.AddRowInternal();
		}
		lines_read++;
	}

	if (iterator.pos.buffer_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer) {
		result.added_last_line = true;
	}
	if (states.IsCarriageReturn() &&
	    state_machine->dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		result.last_position = {iterator.pos.buffer_idx, ++iterator.pos.buffer_pos + 1, result.buffer_size};
	} else {
		result.last_position = {iterator.pos.buffer_idx, ++iterator.pos.buffer_pos, result.buffer_size};
	}
	// Be sure to reset the quoted and escaped variables
	result.quoted = false;
	result.escaped = false;
}